

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O1

void uiter_setString_63(UCharIterator *iter,UChar *s,int32_t length)

{
  long lVar1;
  UCharIterator *pUVar2;
  UCharIterator *pUVar3;
  
  if (iter != (UCharIterator *)0x0) {
    if (length < -1 || s == (UChar *)0x0) {
      pUVar2 = &noopIterator;
      for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
        iter->context = pUVar2->context;
        pUVar2 = (UCharIterator *)&pUVar2->length;
        iter = (UCharIterator *)&iter->length;
      }
    }
    else {
      pUVar2 = &stringIterator;
      pUVar3 = iter;
      for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
        pUVar3->context = pUVar2->context;
        pUVar2 = (UCharIterator *)&pUVar2->length;
        pUVar3 = (UCharIterator *)&pUVar3->length;
      }
      iter->context = s;
      if (length < 0) {
        length = u_strlen_63(s);
      }
      iter->length = length;
      iter->limit = length;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uiter_setString(UCharIterator *iter, const UChar *s, int32_t length) {
    if(iter!=0) {
        if(s!=0 && length>=-1) {
            *iter=stringIterator;
            iter->context=s;
            if(length>=0) {
                iter->length=length;
            } else {
                iter->length=u_strlen(s);
            }
            iter->limit=iter->length;
        } else {
            *iter=noopIterator;
        }
    }
}